

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O3

int parse_at(envy_bios *bios,envy_bios_p *p,int idx,int offset,char **name)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  envy_bios_p_falcon_ucode **ppeVar4;
  uint16_t uVar5;
  envy_bios_bit_entry *peVar6;
  char **ppcVar7;
  uint uVar8;
  envy_bios_p_falcon_ucode **ppeVar9;
  envy_bios_p_falcon_ucode *local_50;
  undefined1 local_48 [8];
  char *local_40;
  char *local_38 [2];
  envy_bios_p_falcon_ucode *local_28;
  
  local_48[0] = 0;
  local_28 = &p->falcon_ucode;
  local_38[0] = "FALCON UCODE";
  peVar6 = p->bit;
  iVar2 = -0x16;
  if (peVar6->version == '\x01') {
    uVar8 = 0;
    ppcVar7 = &local_40;
    ppeVar4 = (envy_bios_p_falcon_ucode **)local_48;
    ppeVar9 = &local_50;
  }
  else {
    if (peVar6->version != '\x02') {
      return -0x16;
    }
    uVar8 = 1;
    ppeVar9 = (envy_bios_p_falcon_ucode **)local_48;
    ppeVar4 = &local_28;
    ppcVar7 = local_38;
  }
  if (idx == -1 || offset == -1) {
    if (-1 < offset) {
      idx = 0;
      do {
        if (uVar8 <= (uint)idx) goto LAB_0026a561;
        idx = 1;
      } while ((uint)*(byte *)ppeVar9 != offset);
      idx = 0;
    }
LAB_0026a561:
    iVar2 = -2;
    if (((uint)idx < uVar8) && (bVar1 = *(byte *)ppeVar9, (ushort)(bVar1 + 2) <= peVar6->t_len)) {
      if (name != (char **)0x0) {
        *name = *ppcVar7;
        peVar6 = p->bit;
      }
      lVar3 = (ulong)peVar6->t_offset + (ulong)bVar1;
      if ((int)lVar3 + 3U < bios->length) {
        uVar5 = *(uint16_t *)(bios->data + lVar3);
        iVar2 = 0;
      }
      else {
        uVar5 = 0;
        fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
        iVar2 = -0xe;
      }
      (*ppeVar4)->offset = uVar5;
    }
  }
  return iVar2;
}

Assistant:

static int
parse_at(struct envy_bios *bios, unsigned int idx, const char **name)
{
	struct envy_bios_d *d = &bios->d;
	struct d_known_tables tbls[] = {
		{ 0x0, &d->dp_info.offset, "DP INFO" },
	};
	int entries_count = (sizeof(tbls) / sizeof(struct d_known_tables));

	/* check the index */
	if (idx >= entries_count)
		return -ENOENT;

	/* check the table has the right size */
	if (tbls[idx].offset + 2 > d->bit->t_len)
		return -ENOENT;

	if (name)
		*name = tbls[idx].name;

	return bios_u16(bios, d->bit->t_offset + tbls[idx].offset, tbls[idx].ptr);
}